

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O3

SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *this,CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *_rhs)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  PointerType pdVar4;
  double dVar5;
  Index index_1;
  Index index;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar3 = (_rhs->m_rows).m_value;
  if ((this->m_matrix->
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_0>
      .m_rows.m_value != uVar3) {
    __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/SelfCwiseBinaryOp.h"
                  ,0x88,
                  "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double>, Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, -1, 1>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, -1, 1>, Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, RhsDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  pdVar4 = (this->m_matrix->
           super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_0>
           .m_data;
  uVar6 = (ulong)((uint)((ulong)pdVar4 >> 3) & 1);
  if ((long)uVar3 <= (long)uVar6) {
    uVar6 = uVar3;
  }
  if (((ulong)pdVar4 & 7) != 0) {
    uVar6 = uVar3;
  }
  dVar2 = (_rhs->m_functor).m_other;
  lVar7 = uVar3 - uVar6;
  if (0 < (long)uVar6) {
    uVar8 = 0;
    do {
      pdVar4[uVar8] = pdVar4[uVar8] * dVar2;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  uVar8 = (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) + uVar6;
  if (1 < lVar7) {
    do {
      pdVar4 = (this->m_matrix->
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_0>
               .m_data;
      pdVar1 = pdVar4 + uVar6;
      dVar5 = pdVar1[1];
      pdVar4 = pdVar4 + uVar6;
      *pdVar4 = *pdVar1 * dVar2;
      pdVar4[1] = dVar5 * dVar2;
      uVar6 = uVar6 + 2;
    } while ((long)uVar6 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar3) {
    pdVar4 = (this->m_matrix->
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_0>
             .m_data;
    do {
      pdVar4[uVar8] = pdVar4[uVar8] * dVar2;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  return this;
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }